

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O1

MessageBuilder * __thiscall tcu::MessageBuilder::operator<<(MessageBuilder *this,VarValue *value)

{
  DataType dataType;
  DataType DVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  ostringstream *stream;
  ulong uVar5;
  ostringstream *poVar6;
  bool bVar7;
  Hex<8UL> local_50;
  float local_44;
  MessageBuilder *local_40;
  ostringstream *local_38;
  
  stream = &this->m_str;
  dataType = (value->type->m_data).basic.type;
  local_40 = this;
  DVar1 = glu::getDataTypeScalarType(dataType);
  uVar2 = glu::getDataTypeScalarSize(dataType);
  if (1 < (int)uVar2) {
    pcVar3 = glu::getDataTypeName(dataType);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)stream +
                      (int)(stream->super_basic_ostream<char,_std::char_traits<char>_>).
                           _vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,"(",1);
  }
  if (0 < (int)uVar2) {
    uVar5 = 0;
    local_38 = stream;
    do {
      if (uVar5 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&stream->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
      }
      if ((int)DVar1 < 0x1f) {
        if (DVar1 == TYPE_FLOAT) {
          local_44 = *(float *)((long)value->value + uVar5 * 4);
          stream = (ostringstream *)std::ostream::_M_insert<double>((double)local_44);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream," / ",3);
          poVar6 = local_38;
          local_50.value._0_4_ = local_44;
LAB_014d52d7:
          local_50.value._4_4_ = 0;
          Format::Hex<8UL>::toStream
                    (&local_50,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
          stream = poVar6;
        }
        else if (DVar1 == TYPE_INT) {
          std::ostream::operator<<(stream,*(int *)((long)value->value + uVar5 * 4));
        }
      }
      else {
        if (DVar1 == TYPE_UINT) {
          local_50.value._0_4_ = *(float *)((long)value->value + uVar5 * 4);
          poVar6 = stream;
          goto LAB_014d52d7;
        }
        if (DVar1 == TYPE_BOOL) {
          bVar7 = *(int *)((long)value->value + uVar5 * 4) == 0;
          pcVar3 = "true";
          if (bVar7) {
            pcVar3 = "false";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&stream->super_basic_ostream<char,_std::char_traits<char>_>,pcVar3,
                     (ulong)bVar7 | 4);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  if (1 < (int)uVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,")",1);
  }
  return local_40;
}

Assistant:

inline MessageBuilder& MessageBuilder::operator<< (const T& value)
{
	// Overload stream operator to implement custom format
	m_str << value;
	return *this;
}